

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fdct8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  uint uVar1;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i _r;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  longlong lVar24;
  int cos_bit_00;
  int iVar25;
  undefined7 in_register_00000011;
  __m256i x2 [8];
  __m256i x3 [8];
  __m256i x1 [8];
  undefined1 in_stack_fffffffffffffb60 [24];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined4 uVar34;
  int iVar35;
  undefined4 uVar36;
  int iVar37;
  undefined4 uVar38;
  int iVar39;
  undefined4 uVar40;
  int iVar41;
  undefined4 uVar42;
  int iVar43;
  undefined4 uVar44;
  int iVar45;
  undefined4 uVar46;
  int iVar47;
  undefined4 uVar48;
  __m256i local_360;
  __m256i local_340;
  __m256i local_320;
  __m256i local_300;
  undefined1 local_2e0 [32];
  longlong local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  longlong local_260;
  longlong lStack_258;
  longlong lStack_250;
  longlong lStack_248;
  longlong local_240;
  longlong lStack_238;
  longlong lStack_230;
  longlong lStack_228;
  longlong local_220;
  longlong lStack_218;
  longlong lStack_210;
  longlong lStack_208;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  __m256i local_1e0;
  __m256i local_1c0;
  __m256i local_1a0;
  __m256i local_180;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  __m256i local_c0;
  __m256i local_a0;
  undefined1 local_80 [32];
  
  cos_bit_00 = (int)CONCAT71(in_register_00000011,cos_bit);
  iVar25 = 1 << (cos_bit - 1U & 0x1f);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + (long)cos_bit_00 * 0x100 + 0x1e0);
  iVar33 = uVar1 * 0x10000 + (uVar1 & 0xffff);
  local_160 = vpaddsw_avx2((undefined1  [32])*input,(undefined1  [32])input[7]);
  local_80 = vpsubsw_avx2((undefined1  [32])*input,(undefined1  [32])input[7]);
  local_140 = vpaddsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[6]);
  local_a0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[6]);
  local_120 = vpaddsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[5]);
  local_c0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[5]);
  local_100 = vpaddsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[4]);
  local_2e0 = vpsubsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[4]);
  local_360 = (__m256i)vpaddsw_avx2(local_160,local_100);
  local_300 = (__m256i)vpsubsw_avx2(local_160,local_100);
  local_340 = (__m256i)vpaddsw_avx2(local_140,local_120);
  local_320 = (__m256i)vpsubsw_avx2(local_140,local_120);
  w0[3] = (longlong)output;
  w0._0_24_ = in_stack_fffffffffffffb60;
  w1[0]._4_4_ = iVar25;
  w1[0]._0_4_ = iVar25;
  w1[1]._0_4_ = iVar25;
  w1[1]._4_4_ = iVar25;
  w1[2]._0_4_ = iVar25;
  w1[2]._4_4_ = iVar25;
  w1[3]._0_4_ = iVar25;
  w1[3]._4_4_ = iVar25;
  _r[0]._4_4_ = iVar33;
  _r[0]._0_4_ = iVar33;
  _r[1]._0_4_ = iVar33;
  _r[1]._4_4_ = iVar33;
  _r[2]._0_4_ = iVar33;
  _r[2]._4_4_ = iVar33;
  _r[3]._0_4_ = iVar33;
  _r[3]._4_4_ = iVar33;
  iVar26 = iVar25;
  iVar27 = iVar25;
  iVar28 = iVar25;
  iVar29 = iVar25;
  iVar30 = iVar25;
  iVar31 = iVar25;
  iVar32 = iVar25;
  iVar35 = iVar33;
  iVar37 = iVar33;
  iVar39 = iVar33;
  iVar41 = iVar33;
  iVar43 = iVar33;
  iVar45 = iVar33;
  iVar47 = iVar33;
  local_e0 = local_2e0;
  btf_16_w16_avx2(w0,w1,&local_c0,&local_a0,_r,cos_bit_00);
  local_2c0 = local_c0[0];
  lStack_2b8 = local_c0[1];
  lStack_2b0 = local_c0[2];
  lStack_2a8 = local_c0[3];
  local_2a0 = local_a0[0];
  lStack_298 = local_a0[1];
  lStack_290 = local_a0[2];
  lStack_288 = local_a0[3];
  local_280 = local_80._0_8_;
  uStack_278 = local_80._8_8_;
  uStack_270 = local_80._16_8_;
  uStack_268 = local_80._24_8_;
  w0_00[3] = (longlong)output;
  w0_00[0] = in_stack_fffffffffffffb60._0_8_;
  w0_00[1] = in_stack_fffffffffffffb60._8_8_;
  w0_00[2] = in_stack_fffffffffffffb60._16_8_;
  w1_00[0]._4_4_ = iVar26;
  w1_00[0]._0_4_ = iVar25;
  w1_00[1]._0_4_ = iVar27;
  w1_00[1]._4_4_ = iVar28;
  w1_00[2]._0_4_ = iVar29;
  w1_00[2]._4_4_ = iVar30;
  w1_00[3]._0_4_ = iVar31;
  w1_00[3]._4_4_ = iVar32;
  _r_00[0]._4_4_ = iVar35;
  _r_00[0]._0_4_ = iVar33;
  _r_00[1]._0_4_ = iVar37;
  _r_00[1]._4_4_ = iVar39;
  _r_00[2]._0_4_ = iVar41;
  _r_00[2]._4_4_ = iVar43;
  _r_00[3]._0_4_ = iVar45;
  _r_00[3]._4_4_ = iVar47;
  btf_16_w16_avx2(w0_00,w1_00,&local_360,&local_340,_r_00,cos_bit_00);
  uVar34 = (undefined4)local_360[0];
  uVar36 = local_360[0]._4_4_;
  uVar38 = (undefined4)local_360[1];
  uVar40 = local_360[1]._4_4_;
  uVar42 = (undefined4)local_360[2];
  uVar44 = local_360[2]._4_4_;
  uVar46 = (undefined4)local_360[3];
  uVar48 = local_360[3]._4_4_;
  lVar5 = local_340[0];
  lVar6 = local_340[1];
  lVar7 = local_340[2];
  lVar8 = local_340[3];
  local_260 = local_360[0];
  lStack_258 = local_360[1];
  lStack_250 = local_360[2];
  lStack_248 = local_360[3];
  local_240 = local_340[0];
  lStack_238 = local_340[1];
  lStack_230 = local_340[2];
  lStack_228 = local_340[3];
  w0_01[3] = (longlong)output;
  w0_01[0] = in_stack_fffffffffffffb60._0_8_;
  w0_01[1] = in_stack_fffffffffffffb60._8_8_;
  w0_01[2] = in_stack_fffffffffffffb60._16_8_;
  w1_01[0]._4_4_ = iVar26;
  w1_01[0]._0_4_ = iVar25;
  w1_01[1]._0_4_ = iVar27;
  w1_01[1]._4_4_ = iVar28;
  w1_01[2]._0_4_ = iVar29;
  w1_01[2]._4_4_ = iVar30;
  w1_01[3]._0_4_ = iVar31;
  w1_01[3]._4_4_ = iVar32;
  btf_16_w16_avx2(w0_01,w1_01,&local_320,&local_300,local_360,cos_bit_00);
  lVar9 = local_320[0];
  lVar10 = local_320[1];
  lVar11 = local_320[2];
  lVar12 = local_320[3];
  lVar13 = local_300[0];
  lVar14 = local_300[1];
  lVar15 = local_300[2];
  lVar16 = local_300[3];
  auVar2._8_8_ = lStack_2b8;
  auVar2._0_8_ = local_2c0;
  auVar2._16_8_ = lStack_2b0;
  auVar2._24_8_ = lStack_2a8;
  local_220 = local_320[0];
  lStack_218 = local_320[1];
  lStack_210 = local_320[2];
  lStack_208 = local_320[3];
  local_200 = local_300[0];
  lStack_1f8 = local_300[1];
  lStack_1f0 = local_300[2];
  lStack_1e8 = local_300[3];
  local_1e0 = (__m256i)vpaddsw_avx2(local_2e0,auVar2);
  local_1c0 = (__m256i)vpsubsw_avx2(local_2e0,auVar2);
  auVar4._8_8_ = uStack_278;
  auVar4._0_8_ = local_280;
  auVar4._16_8_ = uStack_270;
  auVar4._24_8_ = uStack_268;
  auVar3._8_8_ = lStack_298;
  auVar3._0_8_ = local_2a0;
  auVar3._16_8_ = lStack_290;
  auVar3._24_8_ = lStack_288;
  local_1a0 = (__m256i)vpsubsw_avx2(auVar4,auVar3);
  local_180 = (__m256i)vpaddsw_avx2(auVar4,auVar3);
  w0_02[3] = (longlong)output;
  w0_02[0] = in_stack_fffffffffffffb60._0_8_;
  w0_02[1] = in_stack_fffffffffffffb60._8_8_;
  w0_02[2] = in_stack_fffffffffffffb60._16_8_;
  w1_02[0]._4_4_ = iVar26;
  w1_02[0]._0_4_ = iVar25;
  w1_02[1]._0_4_ = iVar27;
  w1_02[1]._4_4_ = iVar28;
  w1_02[2]._0_4_ = iVar29;
  w1_02[2]._4_4_ = iVar30;
  w1_02[3]._0_4_ = iVar31;
  w1_02[3]._4_4_ = iVar32;
  _r_01[0]._4_4_ = uVar36;
  _r_01[0]._0_4_ = uVar34;
  _r_01[1]._0_4_ = uVar38;
  _r_01[1]._4_4_ = uVar40;
  _r_01[2]._0_4_ = uVar42;
  _r_01[2]._4_4_ = uVar44;
  _r_01[3]._0_4_ = uVar46;
  _r_01[3]._4_4_ = uVar48;
  btf_16_w16_avx2(w0_02,w1_02,&local_1e0,&local_180,_r_01,cos_bit_00);
  lVar17 = local_1e0[0];
  lVar18 = local_1e0[1];
  lVar19 = local_1e0[2];
  lVar20 = local_1e0[3];
  lVar21 = local_180[0];
  lVar22 = local_180[1];
  lVar23 = local_180[2];
  lVar24 = local_180[3];
  w0_03[3] = (longlong)output;
  w0_03[0] = in_stack_fffffffffffffb60._0_8_;
  w0_03[1] = in_stack_fffffffffffffb60._8_8_;
  w0_03[2] = in_stack_fffffffffffffb60._16_8_;
  w1_03[0]._4_4_ = iVar26;
  w1_03[0]._0_4_ = iVar25;
  w1_03[1]._0_4_ = iVar27;
  w1_03[1]._4_4_ = iVar28;
  w1_03[2]._0_4_ = iVar29;
  w1_03[2]._4_4_ = iVar30;
  w1_03[3]._0_4_ = iVar31;
  w1_03[3]._4_4_ = iVar32;
  _r_02[0]._4_4_ = uVar36;
  _r_02[0]._0_4_ = uVar34;
  _r_02[1]._0_4_ = uVar38;
  _r_02[1]._4_4_ = uVar40;
  _r_02[2]._0_4_ = uVar42;
  _r_02[2]._4_4_ = uVar44;
  _r_02[3]._0_4_ = uVar46;
  _r_02[3]._4_4_ = uVar48;
  btf_16_w16_avx2(w0_03,w1_03,&local_1c0,&local_1a0,_r_02,cos_bit_00);
  (*output)[0] = CONCAT44(uVar36,uVar34);
  (*output)[1] = CONCAT44(uVar40,uVar38);
  (*output)[2] = CONCAT44(uVar44,uVar42);
  (*output)[3] = CONCAT44(uVar48,uVar46);
  output[1][0] = lVar17;
  output[1][1] = lVar18;
  output[1][2] = lVar19;
  output[1][3] = lVar20;
  output[2][0] = lVar9;
  output[2][1] = lVar10;
  output[2][2] = lVar11;
  output[2][3] = lVar12;
  output[3][0] = local_1a0[0];
  output[3][1] = local_1a0[1];
  output[3][2] = local_1a0[2];
  output[3][3] = local_1a0[3];
  output[4][0] = lVar5;
  output[4][1] = lVar6;
  output[4][2] = lVar7;
  output[4][3] = lVar8;
  output[5][0] = local_1c0[0];
  output[5][1] = local_1c0[1];
  output[5][2] = local_1c0[2];
  output[5][3] = local_1c0[3];
  output[6][0] = lVar13;
  output[6][1] = lVar14;
  output[6][2] = lVar15;
  output[6][3] = lVar16;
  output[7][0] = lVar21;
  output[7][1] = lVar22;
  output[7][2] = lVar23;
  output[7][3] = lVar24;
  return;
}

Assistant:

static inline void fdct8x8_new_avx2(const __m256i *input, __m256i *output,
                                    int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);

  // stage 1
  __m256i x1[8];
  x1[0] = _mm256_adds_epi16(input[0], input[7]);
  x1[7] = _mm256_subs_epi16(input[0], input[7]);
  x1[1] = _mm256_adds_epi16(input[1], input[6]);
  x1[6] = _mm256_subs_epi16(input[1], input[6]);
  x1[2] = _mm256_adds_epi16(input[2], input[5]);
  x1[5] = _mm256_subs_epi16(input[2], input[5]);
  x1[3] = _mm256_adds_epi16(input[3], input[4]);
  x1[4] = _mm256_subs_epi16(input[3], input[4]);

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_adds_epi16(x1[0], x1[3]);
  x2[3] = _mm256_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm256_adds_epi16(x1[1], x1[2]);
  x2[2] = _mm256_subs_epi16(x1[1], x1[2]);
  x2[4] = x1[4];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], __rounding,
                  cos_bit);
  x2[5] = x1[5];
  x2[6] = x1[6];
  x2[7] = x1[7];

  // stage 3
  __m256i x3[8];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x2[0], &x2[1], __rounding,
                  cos_bit);
  x3[0] = x2[0];
  x3[1] = x2[1];
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x2[2], &x2[3], __rounding,
                  cos_bit);
  x3[2] = x2[2];
  x3[3] = x2[3];
  x3[4] = _mm256_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm256_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm256_subs_epi16(x2[7], x2[6]);
  x3[7] = _mm256_adds_epi16(x2[7], x2[6]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x3[4], &x3[7], __rounding,
                  cos_bit);
  x4[4] = x3[4];
  x4[7] = x3[7];
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x3[5], &x3[6], __rounding,
                  cos_bit);
  x4[5] = x3[5];
  x4[6] = x3[6];
  // stage 5
  output[0] = x4[0];
  output[1] = x4[4];
  output[2] = x4[2];
  output[3] = x4[6];
  output[4] = x4[1];
  output[5] = x4[5];
  output[6] = x4[3];
  output[7] = x4[7];
}